

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QServ.cpp
# Opt level: O0

void server::UTFEncode(string *s)

{
  string *psVar1;
  allocator local_f19;
  string local_f18;
  allocator local_ef1;
  string local_ef0;
  allocator local_ec9;
  string local_ec8;
  allocator local_ea1;
  string local_ea0;
  allocator local_e79;
  string local_e78;
  allocator local_e51;
  string local_e50;
  allocator local_e29;
  string local_e28;
  allocator local_e01;
  string local_e00;
  allocator local_dd9;
  string local_dd8;
  allocator local_db1;
  string local_db0;
  allocator local_d89;
  string local_d88;
  allocator local_d61;
  string local_d60;
  allocator local_d39;
  string local_d38;
  allocator local_d11;
  string local_d10;
  allocator local_ce9;
  string local_ce8;
  allocator local_cc1;
  string local_cc0;
  allocator local_c99;
  string local_c98;
  allocator local_c71;
  string local_c70;
  allocator local_c49;
  string local_c48;
  allocator local_c21;
  string local_c20;
  allocator local_bf9;
  string local_bf8;
  allocator local_bd1;
  string local_bd0;
  allocator local_ba9;
  string local_ba8;
  allocator local_b81;
  string local_b80;
  allocator local_b59;
  string local_b58;
  allocator local_b31;
  string local_b30;
  allocator local_b09;
  string local_b08;
  allocator local_ae1;
  string local_ae0;
  allocator local_ab9;
  string local_ab8;
  allocator local_a91;
  string local_a90;
  allocator local_a69;
  string local_a68;
  allocator local_a41;
  string local_a40;
  allocator local_a19;
  string local_a18;
  allocator local_9f1;
  string local_9f0;
  allocator local_9c9;
  string local_9c8;
  allocator local_9a1;
  string local_9a0;
  allocator local_979;
  string local_978;
  allocator local_951;
  string local_950;
  allocator local_929;
  string local_928;
  allocator local_901;
  string local_900;
  allocator local_8d9;
  string local_8d8;
  allocator local_8b1;
  string local_8b0;
  allocator local_889;
  string local_888;
  allocator local_861;
  string local_860;
  allocator local_839;
  string local_838;
  allocator local_811;
  string local_810;
  allocator local_7e9;
  string local_7e8;
  allocator local_7c1;
  string local_7c0;
  allocator local_799;
  string local_798;
  allocator local_771;
  string local_770;
  allocator local_749;
  string local_748;
  allocator local_721;
  string local_720;
  allocator local_6f9;
  string local_6f8;
  allocator local_6d1;
  string local_6d0;
  allocator local_6a9;
  string local_6a8;
  allocator local_681;
  string local_680;
  allocator local_659;
  string local_658;
  allocator local_631;
  string local_630;
  allocator local_609;
  string local_608;
  allocator local_5e1;
  string local_5e0;
  allocator local_5b9;
  string local_5b8;
  allocator local_591;
  string local_590;
  allocator local_569;
  string local_568;
  allocator local_541;
  string local_540;
  allocator local_519;
  string local_518;
  allocator local_4f1;
  string local_4f0;
  allocator local_4c9;
  string local_4c8;
  allocator local_4a1;
  string local_4a0;
  allocator local_479;
  string local_478;
  allocator local_451;
  string local_450;
  allocator local_429;
  string local_428;
  allocator local_401;
  string local_400;
  allocator local_3d9;
  string local_3d8;
  allocator local_3b1;
  string local_3b0;
  allocator local_389;
  string local_388;
  allocator local_361;
  string local_360;
  allocator local_339;
  string local_338;
  allocator local_311;
  string local_310;
  allocator local_2e9;
  string local_2e8;
  allocator local_2c1;
  string local_2c0;
  allocator local_299;
  string local_298;
  allocator local_271;
  string local_270;
  allocator local_249;
  string local_248;
  allocator local_221;
  string local_220;
  allocator local_1f9;
  string local_1f8;
  allocator local_1d1;
  string local_1d0;
  allocator local_1a9;
  string local_1a8;
  allocator local_181;
  string local_180;
  allocator local_159;
  string local_158;
  allocator local_131;
  string local_130;
  allocator local_109;
  string local_108;
  allocator local_e1;
  string local_e0;
  allocator local_b9;
  string local_b8;
  allocator local_91;
  string local_90;
  allocator local_69;
  string local_68;
  allocator local_31;
  string local_30;
  string *local_10;
  string *s_local;
  
  local_10 = s;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_30,anon_var_dwarf_39895,&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_68,"A",&local_69);
  RString(s,&local_30,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  psVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_90,anon_var_dwarf_398ad,&local_91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_b8,"E",&local_b9);
  RString(psVar1,&local_90,&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  psVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_e0,anon_var_dwarf_398c5,&local_e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_108,"I",&local_109);
  RString(psVar1,&local_e0,&local_108);
  std::__cxx11::string::~string((string *)&local_108);
  std::allocator<char>::~allocator((allocator<char> *)&local_109);
  std::__cxx11::string::~string((string *)&local_e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  psVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_130,anon_var_dwarf_398dd,&local_131);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_158,"O",&local_159);
  RString(psVar1,&local_130,&local_158);
  std::__cxx11::string::~string((string *)&local_158);
  std::allocator<char>::~allocator((allocator<char> *)&local_159);
  std::__cxx11::string::~string((string *)&local_130);
  std::allocator<char>::~allocator((allocator<char> *)&local_131);
  psVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_180,anon_var_dwarf_398f5,&local_181);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1a8,"U",&local_1a9);
  RString(psVar1,&local_180,&local_1a8);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a9);
  std::__cxx11::string::~string((string *)&local_180);
  std::allocator<char>::~allocator((allocator<char> *)&local_181);
  psVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1d0,anon_var_dwarf_3990d,&local_1d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1f8,"a",&local_1f9);
  RString(psVar1,&local_1d0,&local_1f8);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
  psVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_220,anon_var_dwarf_39925,&local_221);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_248,"e",&local_249);
  RString(psVar1,&local_220,&local_248);
  std::__cxx11::string::~string((string *)&local_248);
  std::allocator<char>::~allocator((allocator<char> *)&local_249);
  std::__cxx11::string::~string((string *)&local_220);
  std::allocator<char>::~allocator((allocator<char> *)&local_221);
  psVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_270,anon_var_dwarf_3993d,&local_271);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_298,"i",&local_299);
  RString(psVar1,&local_270,&local_298);
  std::__cxx11::string::~string((string *)&local_298);
  std::allocator<char>::~allocator((allocator<char> *)&local_299);
  std::__cxx11::string::~string((string *)&local_270);
  std::allocator<char>::~allocator((allocator<char> *)&local_271);
  psVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2c0,anon_var_dwarf_39955,&local_2c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2e8,"o",&local_2e9);
  RString(psVar1,&local_2c0,&local_2e8);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2e9);
  std::__cxx11::string::~string((string *)&local_2c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2c1);
  psVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_310,anon_var_dwarf_3996d,&local_311);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_338,"u",&local_339);
  RString(psVar1,&local_310,&local_338);
  std::__cxx11::string::~string((string *)&local_338);
  std::allocator<char>::~allocator((allocator<char> *)&local_339);
  std::__cxx11::string::~string((string *)&local_310);
  std::allocator<char>::~allocator((allocator<char> *)&local_311);
  psVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_360,anon_var_dwarf_39985,&local_361);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_388,"E",&local_389);
  RString(psVar1,&local_360,&local_388);
  std::__cxx11::string::~string((string *)&local_388);
  std::allocator<char>::~allocator((allocator<char> *)&local_389);
  std::__cxx11::string::~string((string *)&local_360);
  std::allocator<char>::~allocator((allocator<char> *)&local_361);
  psVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_3b0,anon_var_dwarf_39991,&local_3b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_3d8,"I",&local_3d9);
  RString(psVar1,&local_3b0,&local_3d8);
  std::__cxx11::string::~string((string *)&local_3d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3d9);
  std::__cxx11::string::~string((string *)&local_3b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3b1);
  psVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_400,anon_var_dwarf_3999d,&local_401);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_428,"O",&local_429);
  RString(psVar1,&local_400,&local_428);
  std::__cxx11::string::~string((string *)&local_428);
  std::allocator<char>::~allocator((allocator<char> *)&local_429);
  std::__cxx11::string::~string((string *)&local_400);
  std::allocator<char>::~allocator((allocator<char> *)&local_401);
  psVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_450,anon_var_dwarf_399a9,&local_451);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_478,"U",&local_479);
  RString(psVar1,&local_450,&local_478);
  std::__cxx11::string::~string((string *)&local_478);
  std::allocator<char>::~allocator((allocator<char> *)&local_479);
  std::__cxx11::string::~string((string *)&local_450);
  std::allocator<char>::~allocator((allocator<char> *)&local_451);
  psVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_4a0,anon_var_dwarf_399b5,&local_4a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_4c8,"Y",&local_4c9);
  RString(psVar1,&local_4a0,&local_4c8);
  std::__cxx11::string::~string((string *)&local_4c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_4c9);
  std::__cxx11::string::~string((string *)&local_4a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_4a1);
  psVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_4f0,anon_var_dwarf_399cd,&local_4f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_518,"a",&local_519);
  RString(psVar1,&local_4f0,&local_518);
  std::__cxx11::string::~string((string *)&local_518);
  std::allocator<char>::~allocator((allocator<char> *)&local_519);
  std::__cxx11::string::~string((string *)&local_4f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_4f1);
  psVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_540,anon_var_dwarf_399d9,&local_541);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_568,"e",&local_569);
  RString(psVar1,&local_540,&local_568);
  std::__cxx11::string::~string((string *)&local_568);
  std::allocator<char>::~allocator((allocator<char> *)&local_569);
  std::__cxx11::string::~string((string *)&local_540);
  std::allocator<char>::~allocator((allocator<char> *)&local_541);
  psVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_590,anon_var_dwarf_399e5,&local_591);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_5b8,"i",&local_5b9);
  RString(psVar1,&local_590,&local_5b8);
  std::__cxx11::string::~string((string *)&local_5b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_5b9);
  std::__cxx11::string::~string((string *)&local_590);
  std::allocator<char>::~allocator((allocator<char> *)&local_591);
  psVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_5e0,anon_var_dwarf_399f1,&local_5e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_608,"o",&local_609);
  RString(psVar1,&local_5e0,&local_608);
  std::__cxx11::string::~string((string *)&local_608);
  std::allocator<char>::~allocator((allocator<char> *)&local_609);
  std::__cxx11::string::~string((string *)&local_5e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_5e1);
  psVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_630,anon_var_dwarf_399fd,&local_631);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_658,"u",&local_659);
  RString(psVar1,&local_630,&local_658);
  std::__cxx11::string::~string((string *)&local_658);
  std::allocator<char>::~allocator((allocator<char> *)&local_659);
  std::__cxx11::string::~string((string *)&local_630);
  std::allocator<char>::~allocator((allocator<char> *)&local_631);
  psVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_680,anon_var_dwarf_39a09,&local_681);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_6a8,"y",&local_6a9);
  RString(psVar1,&local_680,&local_6a8);
  std::__cxx11::string::~string((string *)&local_6a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_6a9);
  std::__cxx11::string::~string((string *)&local_680);
  std::allocator<char>::~allocator((allocator<char> *)&local_681);
  psVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_6d0,anon_var_dwarf_39a21,&local_6d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_6f8,"A",&local_6f9);
  RString(psVar1,&local_6d0,&local_6f8);
  std::__cxx11::string::~string((string *)&local_6f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_6f9);
  std::__cxx11::string::~string((string *)&local_6d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_6d1);
  psVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_720,anon_var_dwarf_39a2d,&local_721);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_748,"E",&local_749);
  RString(psVar1,&local_720,&local_748);
  std::__cxx11::string::~string((string *)&local_748);
  std::allocator<char>::~allocator((allocator<char> *)&local_749);
  std::__cxx11::string::~string((string *)&local_720);
  std::allocator<char>::~allocator((allocator<char> *)&local_721);
  psVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_770,anon_var_dwarf_39a39,&local_771);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_798,"I",&local_799);
  RString(psVar1,&local_770,&local_798);
  std::__cxx11::string::~string((string *)&local_798);
  std::allocator<char>::~allocator((allocator<char> *)&local_799);
  std::__cxx11::string::~string((string *)&local_770);
  std::allocator<char>::~allocator((allocator<char> *)&local_771);
  psVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_7c0,anon_var_dwarf_39a45,&local_7c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_7e8,"O",&local_7e9);
  RString(psVar1,&local_7c0,&local_7e8);
  std::__cxx11::string::~string((string *)&local_7e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_7e9);
  std::__cxx11::string::~string((string *)&local_7c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_7c1);
  psVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_810,anon_var_dwarf_39a51,&local_811);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_838,"U",&local_839);
  RString(psVar1,&local_810,&local_838);
  std::__cxx11::string::~string((string *)&local_838);
  std::allocator<char>::~allocator((allocator<char> *)&local_839);
  std::__cxx11::string::~string((string *)&local_810);
  std::allocator<char>::~allocator((allocator<char> *)&local_811);
  psVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_860,anon_var_dwarf_39a5d,&local_861);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_888,"a",&local_889);
  RString(psVar1,&local_860,&local_888);
  std::__cxx11::string::~string((string *)&local_888);
  std::allocator<char>::~allocator((allocator<char> *)&local_889);
  std::__cxx11::string::~string((string *)&local_860);
  std::allocator<char>::~allocator((allocator<char> *)&local_861);
  psVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_8b0,anon_var_dwarf_39a69,&local_8b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_8d8,"e",&local_8d9);
  RString(psVar1,&local_8b0,&local_8d8);
  std::__cxx11::string::~string((string *)&local_8d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_8d9);
  std::__cxx11::string::~string((string *)&local_8b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_8b1);
  psVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_900,anon_var_dwarf_39a75,&local_901);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_928,"i",&local_929);
  RString(psVar1,&local_900,&local_928);
  std::__cxx11::string::~string((string *)&local_928);
  std::allocator<char>::~allocator((allocator<char> *)&local_929);
  std::__cxx11::string::~string((string *)&local_900);
  std::allocator<char>::~allocator((allocator<char> *)&local_901);
  psVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_950,anon_var_dwarf_39a81,&local_951);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_978,"o",&local_979);
  RString(psVar1,&local_950,&local_978);
  std::__cxx11::string::~string((string *)&local_978);
  std::allocator<char>::~allocator((allocator<char> *)&local_979);
  std::__cxx11::string::~string((string *)&local_950);
  std::allocator<char>::~allocator((allocator<char> *)&local_951);
  psVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_9a0,anon_var_dwarf_39a8d,&local_9a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_9c8,"u",&local_9c9);
  RString(psVar1,&local_9a0,&local_9c8);
  std::__cxx11::string::~string((string *)&local_9c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_9c9);
  std::__cxx11::string::~string((string *)&local_9a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_9a1);
  psVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_9f0,anon_var_dwarf_39a99,&local_9f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_a18,"N",&local_a19);
  RString(psVar1,&local_9f0,&local_a18);
  std::__cxx11::string::~string((string *)&local_a18);
  std::allocator<char>::~allocator((allocator<char> *)&local_a19);
  std::__cxx11::string::~string((string *)&local_9f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_9f1);
  psVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_a40,anon_var_dwarf_39ab1,&local_a41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_a68,"O",&local_a69);
  RString(psVar1,&local_a40,&local_a68);
  std::__cxx11::string::~string((string *)&local_a68);
  std::allocator<char>::~allocator((allocator<char> *)&local_a69);
  std::__cxx11::string::~string((string *)&local_a40);
  std::allocator<char>::~allocator((allocator<char> *)&local_a41);
  psVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_a90,anon_var_dwarf_39abd,&local_a91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_ab8,"a",&local_ab9);
  RString(psVar1,&local_a90,&local_ab8);
  std::__cxx11::string::~string((string *)&local_ab8);
  std::allocator<char>::~allocator((allocator<char> *)&local_ab9);
  std::__cxx11::string::~string((string *)&local_a90);
  std::allocator<char>::~allocator((allocator<char> *)&local_a91);
  psVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_ae0,anon_var_dwarf_39ac9,&local_ae1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_b08,"n",&local_b09);
  RString(psVar1,&local_ae0,&local_b08);
  std::__cxx11::string::~string((string *)&local_b08);
  std::allocator<char>::~allocator((allocator<char> *)&local_b09);
  std::__cxx11::string::~string((string *)&local_ae0);
  std::allocator<char>::~allocator((allocator<char> *)&local_ae1);
  psVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_b30,anon_var_dwarf_39ae1,&local_b31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_b58,"o",&local_b59);
  RString(psVar1,&local_b30,&local_b58);
  std::__cxx11::string::~string((string *)&local_b58);
  std::allocator<char>::~allocator((allocator<char> *)&local_b59);
  std::__cxx11::string::~string((string *)&local_b30);
  std::allocator<char>::~allocator((allocator<char> *)&local_b31);
  psVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_b80,anon_var_dwarf_39aed,&local_b81);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_ba8,"A",&local_ba9);
  RString(psVar1,&local_b80,&local_ba8);
  std::__cxx11::string::~string((string *)&local_ba8);
  std::allocator<char>::~allocator((allocator<char> *)&local_ba9);
  std::__cxx11::string::~string((string *)&local_b80);
  std::allocator<char>::~allocator((allocator<char> *)&local_b81);
  psVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_bd0,anon_var_dwarf_39af9,&local_bd1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_bf8,"E",&local_bf9);
  RString(psVar1,&local_bd0,&local_bf8);
  std::__cxx11::string::~string((string *)&local_bf8);
  std::allocator<char>::~allocator((allocator<char> *)&local_bf9);
  std::__cxx11::string::~string((string *)&local_bd0);
  std::allocator<char>::~allocator((allocator<char> *)&local_bd1);
  psVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_c20,anon_var_dwarf_39b05,&local_c21);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_c48,"I",&local_c49);
  RString(psVar1,&local_c20,&local_c48);
  std::__cxx11::string::~string((string *)&local_c48);
  std::allocator<char>::~allocator((allocator<char> *)&local_c49);
  std::__cxx11::string::~string((string *)&local_c20);
  std::allocator<char>::~allocator((allocator<char> *)&local_c21);
  psVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_c70,anon_var_dwarf_39b11,&local_c71);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_c98,"O",&local_c99);
  RString(psVar1,&local_c70,&local_c98);
  std::__cxx11::string::~string((string *)&local_c98);
  std::allocator<char>::~allocator((allocator<char> *)&local_c99);
  std::__cxx11::string::~string((string *)&local_c70);
  std::allocator<char>::~allocator((allocator<char> *)&local_c71);
  psVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_cc0,anon_var_dwarf_39b1d,&local_cc1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_ce8,"U",&local_ce9);
  RString(psVar1,&local_cc0,&local_ce8);
  std::__cxx11::string::~string((string *)&local_ce8);
  std::allocator<char>::~allocator((allocator<char> *)&local_ce9);
  std::__cxx11::string::~string((string *)&local_cc0);
  std::allocator<char>::~allocator((allocator<char> *)&local_cc1);
  psVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_d10,anon_var_dwarf_39b29,&local_d11);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_d38,"Y",&local_d39);
  RString(psVar1,&local_d10,&local_d38);
  std::__cxx11::string::~string((string *)&local_d38);
  std::allocator<char>::~allocator((allocator<char> *)&local_d39);
  std::__cxx11::string::~string((string *)&local_d10);
  std::allocator<char>::~allocator((allocator<char> *)&local_d11);
  psVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_d60,anon_var_dwarf_39b35,&local_d61);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_d88,"a",&local_d89);
  RString(psVar1,&local_d60,&local_d88);
  std::__cxx11::string::~string((string *)&local_d88);
  std::allocator<char>::~allocator((allocator<char> *)&local_d89);
  std::__cxx11::string::~string((string *)&local_d60);
  std::allocator<char>::~allocator((allocator<char> *)&local_d61);
  psVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_db0,anon_var_dwarf_39b41,&local_db1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_dd8,"e",&local_dd9);
  RString(psVar1,&local_db0,&local_dd8);
  std::__cxx11::string::~string((string *)&local_dd8);
  std::allocator<char>::~allocator((allocator<char> *)&local_dd9);
  std::__cxx11::string::~string((string *)&local_db0);
  std::allocator<char>::~allocator((allocator<char> *)&local_db1);
  psVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_e00,anon_var_dwarf_39b4d,&local_e01);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_e28,"i",&local_e29);
  RString(psVar1,&local_e00,&local_e28);
  std::__cxx11::string::~string((string *)&local_e28);
  std::allocator<char>::~allocator((allocator<char> *)&local_e29);
  std::__cxx11::string::~string((string *)&local_e00);
  std::allocator<char>::~allocator((allocator<char> *)&local_e01);
  psVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_e50,anon_var_dwarf_39b59,&local_e51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_e78,"o",&local_e79);
  RString(psVar1,&local_e50,&local_e78);
  std::__cxx11::string::~string((string *)&local_e78);
  std::allocator<char>::~allocator((allocator<char> *)&local_e79);
  std::__cxx11::string::~string((string *)&local_e50);
  std::allocator<char>::~allocator((allocator<char> *)&local_e51);
  psVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_ea0,anon_var_dwarf_39b65,&local_ea1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_ec8,"u",&local_ec9);
  RString(psVar1,&local_ea0,&local_ec8);
  std::__cxx11::string::~string((string *)&local_ec8);
  std::allocator<char>::~allocator((allocator<char> *)&local_ec9);
  std::__cxx11::string::~string((string *)&local_ea0);
  std::allocator<char>::~allocator((allocator<char> *)&local_ea1);
  psVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_ef0,anon_var_dwarf_39b71,&local_ef1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_f18,"y",&local_f19);
  RString(psVar1,&local_ef0,&local_f18);
  std::__cxx11::string::~string((string *)&local_f18);
  std::allocator<char>::~allocator((allocator<char> *)&local_f19);
  std::__cxx11::string::~string((string *)&local_ef0);
  std::allocator<char>::~allocator((allocator<char> *)&local_ef1);
  return;
}

Assistant:

void UTFEncode(std::string& s) {
        RString(s, "À", "A"); RString(s, "È", "E"); RString(s, "Ì", "I");
        RString(s, "Ò", "O"); RString(s, "Ù", "U"); RString(s, "à", "a");
        RString(s, "è", "e"); RString(s, "ì", "i"); RString(s, "ò", "o");
        RString(s, "ù", "u"); RString(s, "É", "E"); RString(s, "Í", "I");
        RString(s, "Ó", "O"); RString(s, "Ú", "U"); RString(s, "Ý", "Y");
        RString(s, "á", "a"); RString(s, "é", "e"); RString(s, "í", "i");
        RString(s, "ó", "o"); RString(s, "ú", "u"); RString(s, "ý", "y");
        RString(s, "Â", "A"); RString(s, "Ê", "E"); RString(s, "Î", "I");
        RString(s, "Ô", "O"); RString(s, "Û", "U"); RString(s, "â", "a");
        RString(s, "ê", "e"); RString(s, "î", "i"); RString(s, "ô", "o");
        RString(s, "û", "u"); RString(s, "Ñ", "N"); RString(s, "Õ", "O");
        RString(s, "ã", "a"); RString(s, "ñ", "n"); RString(s, "õ", "o");
        RString(s, "Ä", "A"); RString(s, "Ë", "E"); RString(s, "Ï", "I");
        RString(s, "Ö", "O"); RString(s, "Ü", "U"); RString(s, "Ÿ", "Y");
        RString(s, "ä", "a"); RString(s, "ë", "e"); RString(s, "ï", "i");
        RString(s, "ö", "o"); RString(s, "ü", "u"); RString(s, "ÿ", "y");
    }